

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O2

Vector2 Vector2MoveTowards(Vector2 v,Vector2 target,float maxDistance)

{
  Vector2 VVar1;
  float in_XMM0_Dc;
  float in_XMM0_Dd;
  undefined8 in_XMM1_Qb;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  float fVar4;
  
  auVar2._0_4_ = target.x - v.x;
  auVar2._4_4_ = target.y - v.y;
  auVar2._8_4_ = (float)in_XMM1_Qb - in_XMM0_Dc;
  auVar2._12_4_ = (float)((ulong)in_XMM1_Qb >> 0x20) - in_XMM0_Dd;
  fVar4 = SQRT(auVar2._0_4_ * auVar2._0_4_ + auVar2._4_4_ * auVar2._4_4_);
  auVar3._4_4_ = fVar4;
  auVar3._0_4_ = fVar4;
  auVar3._8_4_ = fVar4;
  auVar3._12_4_ = fVar4;
  auVar3 = divps(auVar2,auVar3);
  VVar1.y = v.y + maxDistance * auVar3._4_4_;
  VVar1.x = v.x + maxDistance * auVar3._0_4_;
  return VVar1;
}

Assistant:

RMDEF Vector2 Vector2MoveTowards(Vector2 v, Vector2 target, float maxDistance)
{
    Vector2 result = { 0 };
    float dx = target.x - v.x;
    float dy = target.y - v.y;
    float value = (dx*dx) + (dy*dy);

    if ((value == 0) || ((maxDistance >= 0) && (value <= maxDistance*maxDistance))) result = target;

    float dist = sqrtf(value);

    result.x = v.x + dx/dist*maxDistance;
    result.y = v.y + dy/dist*maxDistance;

    return result;
}